

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

bool __thiscall
InsertProxyModel::setItemData(InsertProxyModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  _Base_ptr *this_00;
  int iVar1;
  InsertProxyModelPrivate *pIVar2;
  bool bVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  RolesContainer *this_01;
  _Base_ptr p_Var12;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar13;
  const_iterator cVar14;
  iterator iVar15;
  iterator iVar16;
  QVariant *pQVar17;
  _Rb_tree_node_base *p_Var18;
  const_iterator cVar19;
  byte bVar20;
  byte bVar21;
  QVector<int> changedRoles;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  QMap<int,_QVariant> *local_38;
  
  bVar3 = QModelIndex::isValid(index);
  if ((bVar3) && (lVar9 = QAbstractProxyModel::sourceModel(), lVar9 != 0)) {
    plVar10 = (long *)QAbstractProxyModel::sourceModel();
    changedRoles.d.d = (Data *)0xffffffffffffffff;
    changedRoles.d.ptr = (int *)0x0;
    changedRoles.d.size = 0;
    iVar6 = (**(code **)(*plVar10 + 0x78))(plVar10,&changedRoles);
    plVar10 = (long *)QAbstractProxyModel::sourceModel();
    changedRoles.d.d = (Data *)0xffffffffffffffff;
    changedRoles.d.ptr = (int *)0x0;
    changedRoles.d.size = 0;
    iVar7 = (**(code **)(*plVar10 + 0x80))(plVar10,&changedRoles);
    pIVar2 = this->m_dptr;
    QModelIndex::parent((QModelIndex *)&changedRoles,index);
    if (((((int)changedRoles.d.d < 0) ||
         (((long)changedRoles.d.d < 0 || (changedRoles.d.size == 0)))) &&
        (iVar8 = index->r, iVar8 <= iVar6)) &&
       (((iVar1 = index->c, iVar1 <= iVar7 &&
         ((iVar8 != iVar6 || (((pIVar2->m_insertDirection).i & 1) != 0)))) &&
        ((iVar1 != iVar7 || (((pIVar2->m_insertDirection).i & 2) != 0)))))) {
      if (iVar8 == iVar6) {
        bVar20 = (byte)(pIVar2->m_insertDirection).i & 1;
      }
      else {
        bVar20 = 0;
      }
      if (iVar1 == iVar7) {
        bVar21 = ((byte)(pIVar2->m_insertDirection).i & 2) >> 1;
      }
      else {
        bVar21 = 0;
      }
      if (bVar20 != 0 || bVar21 != 0) {
        if ((bVar21 & bVar20) == 1) {
          this_01 = &pIVar2->m_dataForCorner;
        }
        else {
          if (bVar20 != 0) {
            iVar8 = iVar1;
          }
          this_01 = QList<QMap<int,_QVariant>_>::operator[]
                              (pIVar2->m_extraData + bVar20,(long)iVar8);
        }
        changedRoles.d.size = 0;
        changedRoles.d.d = (Data *)0x0;
        changedRoles.d.ptr = (int *)0x0;
        pQVar13 = (roles->d).d;
        local_38 = roles;
        if (pQVar13 ==
            (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
             *)0x0) {
          p_Var12 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var12 = (pQVar13->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        while( true ) {
          p_Var18 = &(pQVar13->m)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (pQVar13 ==
              (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
               *)0x0) {
            p_Var18 = (_Rb_tree_node_base *)0x0;
          }
          if (p_Var12 == p_Var18) break;
          this_00 = &p_Var12[1]._M_parent;
          bVar3 = ::QVariant::isValid((QVariant *)this_00);
          if (bVar3) {
            p_Var18 = p_Var12 + 1;
            iVar15 = QMap<int,_QVariant>::find(this_01,(int *)p_Var18);
            iVar16._M_node = (_Base_ptr)QMap<int,_QVariant>::end(this_01);
            if (iVar15.i._M_node == (iterator)iVar16._M_node) {
              bVar3 = ::QVariant::isValid((QVariant *)this_00);
              if (bVar3) {
                QList<int>::append(&changedRoles,p_Var18->_M_color);
                QMap<int,_QVariant>::insert(this_01,(int *)p_Var18,(QVariant *)this_00);
              }
            }
            else {
              bVar3 = ::QVariant::isValid((QVariant *)this_00);
              if (bVar3) {
                bVar3 = operator!=((QVariant *)((long)iVar15.i._M_node + 0x28),(QVariant *)this_00);
                if (bVar3) {
                  QList<int>::append(&changedRoles,p_Var18->_M_color);
                  ::QVariant::operator=
                            ((QVariant *)((long)iVar15.i._M_node + 0x28),(QVariant *)this_00);
                }
              }
              else {
                QList<int>::append(&changedRoles,p_Var18->_M_color);
                QMap<int,_QVariant>::erase(this_01,(const_iterator)iVar15.i._M_node);
              }
            }
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          pQVar13 = (local_38->d).d;
        }
        if (changedRoles.d.size != 0) {
          local_50 = local_50 & 0xffffffff00000000;
          bVar3 = std::binary_search<QList<int>::const_iterator,Qt::ItemDataRole>
                            ((const_iterator)changedRoles.d.ptr,
                             (const_iterator)(changedRoles.d.ptr + changedRoles.d.size),
                             (ItemDataRole *)&local_50);
          local_50 = CONCAT44(local_50._4_4_,2);
          bVar5 = std::binary_search<QList<int>::const_iterator,Qt::ItemDataRole>
                            ((const_iterator)changedRoles.d.ptr,
                             (const_iterator)(changedRoles.d.ptr + changedRoles.d.size),
                             (ItemDataRole *)&local_50);
          if (pIVar2->m_separateEditDisplay == false) {
            if (bVar3 && bVar5) {
              local_50 = local_50 & 0xffffffff00000000;
              cVar14 = QMap<int,_QVariant>::find(this_01,(int *)&local_50);
              local_50 = CONCAT44(local_50._4_4_,2);
              iVar15 = QMap<int,_QVariant>::find(this_01,(int *)&local_50);
              pQVar13 = (this_01->d).d;
              cVar19._M_node = &(pQVar13->m)._M_t._M_impl.super__Rb_tree_header._M_header;
              if (pQVar13 ==
                  (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
                cVar19._M_node = (_Base_ptr)0x0;
              }
              if (cVar14.i._M_node == (const_iterator)cVar19._M_node) {
                iVar16._M_node = (_Base_ptr)QMap<int,_QVariant>::end(this_01);
                if (iVar15.i._M_node != (iterator)iVar16._M_node) {
                  QMap<int,_QVariant>::erase(this_01,(const_iterator)iVar15.i._M_node);
                }
              }
              else {
                iVar16._M_node = (_Base_ptr)QMap<int,_QVariant>::end(this_01);
                if (iVar15.i._M_node == (iterator)iVar16._M_node) {
                  local_50 = CONCAT44(local_50._4_4_,2);
                  QMap<int,_QVariant>::insert
                            (this_01,(int *)&local_50,(QVariant *)((long)cVar14.i._M_node + 0x28));
                }
                else {
                  ::QVariant::operator=
                            ((QVariant *)((long)iVar15.i._M_node + 0x28),
                             (QVariant *)((long)cVar14.i._M_node + 0x28));
                }
              }
            }
            else if (bVar3 != bVar5) {
              if (bVar3) {
                local_50 = (ulong)local_50._4_4_ << 0x20;
                cVar14 = QMap<int,_QVariant>::find(this_01,(int *)&local_50);
                pQVar13 = (this_01->d).d;
                cVar19._M_node = &(pQVar13->m)._M_t._M_impl.super__Rb_tree_header._M_header;
                if (pQVar13 ==
                    (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
                  cVar19._M_node = (_Base_ptr)0x0;
                }
                if (cVar14.i._M_node == (const_iterator)cVar19._M_node) {
                  local_50 = CONCAT44(local_50._4_4_,2);
                  QMap<int,_QVariant>::remove(this_01,(char *)&local_50);
                }
                else {
                  local_50 = CONCAT44(local_50._4_4_,2);
                  pQVar17 = QMap<int,_QVariant>::operator[](this_01,(int *)&local_50);
                  ::QVariant::operator=(pQVar17,(QVariant *)((long)cVar14.i._M_node + 0x28));
                }
                QList<int>::append(&changedRoles,2);
              }
              else {
                local_50._0_4_ = EditRole;
                cVar14 = QMap<int,_QVariant>::find(this_01,(int *)&local_50);
                pQVar13 = (this_01->d).d;
                cVar19._M_node = &(pQVar13->m)._M_t._M_impl.super__Rb_tree_header._M_header;
                if (pQVar13 ==
                    (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
                  cVar19._M_node = (_Base_ptr)0x0;
                }
                if (cVar14.i._M_node == (const_iterator)cVar19._M_node) {
                  local_50 = (ulong)local_50._4_4_ << 0x20;
                  QMap<int,_QVariant>::remove(this_01,(char *)&local_50);
                }
                else {
                  local_50 = (ulong)local_50._4_4_ << 0x20;
                  pQVar17 = QMap<int,_QVariant>::operator[](this_01,(int *)&local_50);
                  ::QVariant::operator=(pQVar17,(QVariant *)((long)cVar14.i._M_node + 0x28));
                }
                QList<int>::append(&changedRoles,0);
              }
            }
          }
          QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
          extraDataChanged(this,index,index,&changedRoles);
        }
        QArrayDataPointer<int>::~QArrayDataPointer(&changedRoles.d);
        return true;
      }
      plVar10 = (long *)QAbstractProxyModel::sourceModel();
      plVar11 = (long *)QAbstractProxyModel::sourceModel();
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      (**(code **)(*plVar11 + 0x60))(&changedRoles,plVar11,index->r,index->c);
      uVar4 = (**(code **)(*plVar10 + 0xb8))(plVar10,&changedRoles,roles);
      return (bool)uVar4;
    }
  }
  return false;
}

Assistant:

bool InsertProxyModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;
    if (!sourceModel())
        return false;
    const int sourceRows = sourceModel()->rowCount();
    const int sourceCols = sourceModel()->columnCount();
    Q_D(InsertProxyModel);
    if (index.parent().isValid() || index.row() > sourceRows || index.column() > sourceCols
        || (index.row() == sourceRows && !(d->m_insertDirection & InsertRow))
        || (index.column() == sourceCols && !(d->m_insertDirection & InsertColumn)))
        return false;
    const bool isExtraRow = index.row() == sourceRows && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceCols && d->m_insertDirection & InsertColumn;
    if (!(isExtraRow || isExtraCol))
        return sourceModel()->setItemData(sourceModel()->index(index.row(), index.column()), roles);

    const int sectionIdx = isExtraRow ? index.column() : index.row();
    RolesContainer *const dataContainer = (isExtraRow && isExtraCol) ? &d->m_dataForCorner : &d->m_extraData[isExtraRow][sectionIdx];
    QVector<int> changedRoles;
    for (auto i = roles.cbegin(); i != roles.cend(); ++i) {
        if (i.value().isValid()) {
            const auto oldDataIter = dataContainer->find(i.key());
            if (oldDataIter == dataContainer->end()) {
                if (i.value().isValid()) {
                    changedRoles << i.key();
                    dataContainer->insert(i.key(), i.value());
                }
            } else if (!i.value().isValid()) {
                changedRoles << i.key();
                dataContainer->erase(oldDataIter);
                continue;
            } else if (oldDataIter.value() != i.value()) {
                changedRoles << i.key();
                oldDataIter.value() = i.value();
            }
        }
    }
    if (changedRoles.isEmpty())
        return true;
    Q_ASSERT(std::is_sorted(changedRoles.cbegin(), changedRoles.cend()));
    const bool hasDisplay = std::binary_search(changedRoles.cbegin(), changedRoles.cend(), Qt::DisplayRole);
    const bool hasEdit = std::binary_search(changedRoles.cbegin(), changedRoles.cend(), Qt::EditRole);
    if (!d->m_separateEditDisplay) {
        if (hasDisplay && hasEdit) {
            const auto displayIter = dataContainer->constFind(Qt::DisplayRole);
            const auto editIter = dataContainer->find(Qt::EditRole);
            // in QStandardItemModel DisplayRole wins over EditRole so we do the same
            if (displayIter == dataContainer->cend()) {
                if (editIter != dataContainer->end()) {
                    dataContainer->erase(editIter);
                }
            } else {
                if (editIter == dataContainer->end())
                    dataContainer->insert(Qt::EditRole, displayIter.value());
                else
                    editIter.value() = displayIter.value(); // assign without checking should optimise memory use due to implicit sharing
            }
        } else if (hasDisplay != hasEdit) {
            if (hasDisplay) {
                const auto displayIter = dataContainer->constFind(Qt::DisplayRole);
                if (displayIter == dataContainer->constEnd()) {
                    Q_ASSERT(dataContainer->contains(Qt::EditRole));
                    dataContainer->remove(Qt::EditRole);
                } else {
                    dataContainer->operator[](Qt::EditRole) = displayIter.value();
                }
                changedRoles << Qt::EditRole;
            } else {
                const auto editIter = dataContainer->constFind(Qt::EditRole);
                if (editIter == dataContainer->constEnd()) {
                    Q_ASSERT(dataContainer->contains(Qt::DisplayRole));
                    dataContainer->remove(Qt::DisplayRole);
                } else {
                    dataContainer->operator[](Qt::DisplayRole) = editIter.value();
                }
                changedRoles << Qt::DisplayRole;
            }
        }
    }
    Q_EMIT dataChanged(index, index, changedRoles);
    Q_EMIT extraDataChanged(index, index, changedRoles);
    return true;
}